

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool container_iterate(container_t *c,uint8_t type,uint32_t base,roaring_iterator iterator,
                       void *ptr)

{
  void *ptr_local;
  roaring_iterator iterator_local;
  uint32_t base_local;
  uint8_t type_local;
  container_t *c_local;
  
  iterator_local._0_4_ = base;
  iterator_local._7_1_ = type;
  _base_local = (array_container_t *)c;
  _base_local = (array_container_t *)
                container_unwrap_shared(c,(uint8_t *)((long)&iterator_local + 7));
  if (iterator_local._7_1_ == '\x01') {
    c_local._7_1_ =
         bitset_container_iterate
                   ((bitset_container_t *)_base_local,(uint32_t)iterator_local,iterator,ptr);
  }
  else if (iterator_local._7_1_ == '\x02') {
    c_local._7_1_ = array_container_iterate(_base_local,(uint32_t)iterator_local,iterator,ptr);
  }
  else {
    if (iterator_local._7_1_ != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x17e9,
                    "_Bool container_iterate(const container_t *, uint8_t, uint32_t, roaring_iterator, void *)"
                   );
    }
    c_local._7_1_ =
         run_container_iterate((run_container_t *)_base_local,(uint32_t)iterator_local,iterator,ptr)
    ;
  }
  return c_local._7_1_;
}

Assistant:

static inline bool container_iterate(
    const container_t *c, uint8_t type,
    uint32_t base,
    roaring_iterator iterator, void *ptr
){
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_iterate(const_CAST_bitset(c),
                                            base, iterator, ptr);
        case ARRAY_CONTAINER_TYPE:
            return array_container_iterate(const_CAST_array(c),
                                           base, iterator, ptr);
        case RUN_CONTAINER_TYPE:
            return run_container_iterate(const_CAST_run(c),
                                         base, iterator, ptr);
        default:
            assert(false);
            __builtin_unreachable();
    }
    assert(false);
    __builtin_unreachable();
    return false;
}